

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O3

void * matras_alloc_internal(matras *m)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  matras_allocator *pmVar7;
  uint uVar8;
  uint uVar9;
  char cVar10;
  uint uVar11;
  
  uVar1 = (uint)(m->head).block_count;
  bVar2 = (byte)m->shift1 & 0x1f;
  uVar11 = uVar1 >> bVar2;
  uVar3 = m->mask1 & uVar1;
  uVar8 = uVar3 >> ((byte)m->shift2 & 0x1f);
  uVar9 = m->mask2 & uVar3;
  if (uVar1 == 0) {
    pmVar7 = m->allocator;
    if (pmVar7->num_reserved_extents < 1) {
      puVar4 = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
      if (puVar4 == (undefined8 *)0x0) {
        return (void *)0x0;
      }
    }
    else {
      puVar4 = (undefined8 *)pmVar7->reserved_extents;
      pmVar7->reserved_extents = (void *)*puVar4;
      pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    (m->head).root = puVar4;
LAB_00103c1d:
    pmVar7 = m->allocator;
    if (pmVar7->num_reserved_extents < 1) {
      puVar5 = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
      if (puVar5 == (undefined8 *)0x0) {
        if (uVar1 != 0) {
          return (void *)0x0;
        }
        pmVar7 = m->allocator;
        goto LAB_00103cfd;
      }
    }
    else {
      puVar5 = (undefined8 *)pmVar7->reserved_extents;
      pmVar7->reserved_extents = (void *)*puVar5;
      pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    puVar4[uVar11] = puVar5;
    cVar10 = '\x01';
    puVar6 = puVar4;
    puVar4 = puVar5;
  }
  else {
    puVar4 = (undefined8 *)(m->head).root;
    if (uVar3 == 0) goto LAB_00103c1d;
    cVar10 = (char)(0 >> bVar2);
    puVar6 = puVar4;
    puVar4 = (undefined8 *)puVar4[uVar11];
  }
  if (uVar9 == 0) {
    pmVar7 = m->allocator;
    if (pmVar7->num_reserved_extents < 1) {
      puVar5 = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
      if (puVar5 == (undefined8 *)0x0) {
        if (uVar1 == 0) {
          (*m->allocator->free_func)(m->allocator,puVar6);
          m->extent_count = m->extent_count - 1;
          m->stats->extent_count = m->stats->extent_count - 1;
        }
        if (cVar10 == '\0') {
          return (void *)0x0;
        }
        pmVar7 = m->allocator;
LAB_00103cfd:
        (*pmVar7->free_func)(pmVar7,puVar4);
        m->extent_count = m->extent_count - 1;
        m->stats->extent_count = m->stats->extent_count - 1;
        return (void *)0x0;
      }
    }
    else {
      puVar5 = (undefined8 *)pmVar7->reserved_extents;
      pmVar7->reserved_extents = (void *)*puVar5;
      pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
    }
    m->extent_count = m->extent_count + 1;
    m->stats->extent_count = m->stats->extent_count + 1;
    puVar4[uVar8] = puVar5;
  }
  else {
    puVar5 = (undefined8 *)puVar4[uVar8];
  }
  return (void *)((ulong)(uVar9 * m->block_size) + (long)puVar5);
}

Assistant:

static void *
matras_alloc_internal(struct matras *m)
{
	/* Current block_count is the ID of new block */
	matras_id_t id = m->head.block_count;

	/* See "Shifts and masks explanation" for details */
	/* Additionally we determine if we must allocate extents.
	 * Basically,
	 * if n1 == 0 && n2 == 0 && n3 == 0, we must allocate root extent,
	 * if n2 == 0 && n3 == 0, we must allocate second level extent,
	 * if n3 == 0, we must allocate third level extent.
	 * Optimization:
	 * (n1 == 0 && n2 == 0 && n3 == 0) is identical to (id == 0)
	 * (n2 == 0 && n3 == 0) is identical to (id & mask1 == 0)
	 */
	matras_id_t extent1_available = id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	matras_id_t extent2_available = id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	matras_id_t extent3_available = id;
	matras_id_t n3 = id;

	void **extent1, **extent2;
	char *extent3;

	if (extent1_available) {
		extent1 = (void **)m->head.root;
	} else {
		extent1 = (void **)matras_alloc_extent(m);
		if (!extent1)
			return 0;
		m->head.root = (void *)extent1;
	}

	if (extent2_available) {
		extent2 = (void **)extent1[n1];
	} else {
		extent2 = (void **)matras_alloc_extent(m);
		if (!extent2) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			return 0;
		}
		extent1[n1] = (void *)extent2;
	}

	if (extent3_available) {
		extent3 = (char *)extent2[n2];
	} else {
		extent3 = (char *)matras_alloc_extent(m);
		if (!extent3) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			if (!extent2_available) /* was created */
				matras_free_extent(m, extent2);
			return 0;
		}
		extent2[n2] = (void *)extent3;
	}

	return (void *)(extent3 + n3 * m->block_size);
}